

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O1

void __thiscall Exception::Exception(Exception *this,ExceptionsEnum exception,string *msg)

{
  *(undefined ***)this = &PTR__Exception_00127d28;
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->msg,"");
  this->exception = exception;
  std::__cxx11::string::_M_assign((string *)&this->msg);
  return;
}

Assistant:

Exception::Exception(ExceptionsEnum exception, const string &msg) {
    this->exception = exception;
    this->msg = msg;
}